

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UUID.cpp
# Opt level: O0

string * UUID::newUUID_abi_cxx11_(void)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  CryptoFactory *pCVar5;
  undefined4 extraout_var;
  undefined4 *puVar6;
  byte *pbVar7;
  string *in_RDI;
  char uuidStr [37];
  ByteString uuid;
  RNG *rng;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdbc;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  allocator local_a9;
  char local_a8 [64];
  undefined1 local_68 [40];
  long *local_40;
  
  pCVar5 = CryptoFactory::i();
  iVar4 = (*pCVar5->_vptr_CryptoFactory[8])(pCVar5,1);
  local_40 = (long *)CONCAT44(extraout_var,iVar4);
  ByteString::ByteString((ByteString *)0x14c18f);
  bVar3 = (**(code **)(*local_40 + 0x10))(local_40,local_68,0x10);
  if ((bVar3 & 1) == 0) {
    softHSMLog(3,"newUUID",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/UUID.cpp"
               ,0x33,"Fatal, could not generate random UUID");
    puVar6 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar6 = 0xffffffff;
    __cxa_throw(puVar6,&int::typeinfo,0);
  }
  pbVar7 = ByteString::operator[]
                     ((ByteString *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                      CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  bVar3 = *pbVar7;
  pbVar7 = ByteString::operator[]
                     ((ByteString *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                      CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  bVar1 = *pbVar7;
  pbVar7 = ByteString::operator[]
                     ((ByteString *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                      CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  bVar2 = *pbVar7;
  ByteString::operator[]
            ((ByteString *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
             CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  ByteString::operator[]
            ((ByteString *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
             CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  ByteString::operator[]
            ((ByteString *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
             CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  ByteString::operator[]
            ((ByteString *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
             CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  ByteString::operator[]
            ((ByteString *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
             CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  ByteString::operator[]
            ((ByteString *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
             CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  ByteString::operator[]
            ((ByteString *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
             CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  ByteString::operator[]
            ((ByteString *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
             CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  ByteString::operator[]
            ((ByteString *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
             CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  ByteString::operator[]
            ((ByteString *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
             CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  ByteString::operator[]
            ((ByteString *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
             CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  ByteString::operator[]
            ((ByteString *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
             CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  ByteString::operator[]
            ((ByteString *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
             CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  snprintf(local_a8,0x25,"%02x%02x%02x%02x-%02x%02x-%02x%02x-%02x%02x-%02x%02x%02x%02x%02x%02x",
           (ulong)bVar3,(ulong)bVar1,(ulong)bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,local_a8,&local_a9);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  ByteString::~ByteString((ByteString *)0x14c61c);
  return in_RDI;
}

Assistant:

std::string UUID::newUUID()
{
	RNG* rng = CryptoFactory::i()->getRNG();

	ByteString uuid;

	if (!rng->generateRandom(uuid, 16))
	{
		ERROR_MSG("Fatal, could not generate random UUID");

		throw -1;
	}

	// Convert it to a string
	char uuidStr[37];
	snprintf(uuidStr, sizeof(uuidStr),
		"%02x%02x%02x%02x-%02x%02x-%02x%02x-%02x%02x-%02x%02x%02x%02x%02x%02x",
		uuid[0], uuid[1], uuid[2], uuid[3],
		uuid[4], uuid[5],
		uuid[6], uuid[7],
		uuid[8], uuid[9],
		uuid[10], uuid[11], uuid[12], uuid[13], uuid[14], uuid[15]);

	return std::string(uuidStr);
}